

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void DC8uvNoTop_SSE2(uint8_t *dst)

{
  uint8_t *in_RDI;
  int i;
  int dc0;
  int local_10;
  int local_c;
  
  local_c = 4;
  for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
    local_c = (uint)in_RDI[local_10 * 0x20 + -1] + local_c;
  }
  Put8x8uv_SSE2((uint8_t)(local_c >> 3),in_RDI);
  return;
}

Assistant:

static void DC8uvNoTop_SSE2(uint8_t* dst) {  // DC with no top samples
  int dc0 = 4;
  int i;
  for (i = 0; i < 8; ++i) {
    dc0 += dst[-1 + i * BPS];
  }
  Put8x8uv_SSE2(dc0 >> 3, dst);
}